

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_nullddi.cpp
# Opt level: O0

ze_result_t
driver::zeDeviceCanAccessPeer
          (ze_device_handle_t hDevice,ze_device_handle_t hPeerDevice,ze_bool_t *value)

{
  ze_pfnDeviceCanAccessPeer_t pfnCanAccessPeer;
  ze_result_t result;
  ze_bool_t *value_local;
  ze_device_handle_t hPeerDevice_local;
  ze_device_handle_t hDevice_local;
  
  pfnCanAccessPeer._4_4_ = ZE_RESULT_SUCCESS;
  if (DAT_0011c278 != (code *)0x0) {
    pfnCanAccessPeer._4_4_ = (*DAT_0011c278)(hDevice,hPeerDevice,value);
  }
  return pfnCanAccessPeer._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeDeviceCanAccessPeer(
        ze_device_handle_t hDevice,                     ///< [in] handle of the device performing the access
        ze_device_handle_t hPeerDevice,                 ///< [in] handle of the peer device with the allocation
        ze_bool_t* value                                ///< [out] returned access capability
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnCanAccessPeer = context.zeDdiTable.Device.pfnCanAccessPeer;
        if( nullptr != pfnCanAccessPeer )
        {
            result = pfnCanAccessPeer( hDevice, hPeerDevice, value );
        }
        else
        {
            // generic implementation
        }

        return result;
    }